

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O3

xmlGlobalStatePtr xmlGetThreadLocalStorage(int allowFailure)

{
  xmlGlobalStatePtr gs;
  
  xmlInitParser();
  gs = (xmlGlobalStatePtr)pthread_getspecific(globalkey);
  if (gs == (xmlGlobalStatePtr)0x0) {
    gs = (xmlGlobalStatePtr)calloc(1,0xd0);
    if (gs == (xmlGlobalStatePtr)0x0) {
      if (allowFailure != 0) {
        return (xmlGlobalStatePtr)0x0;
      }
      xmlAbort(
              "libxml2: Failed to allocate globals for thread\nlibxml2: See xmlCheckThreadLocalStorage\n"
              );
      memset((void *)0x0,0,0xd0);
      gs = (xmlGlobalStatePtr)0x0;
    }
    xmlInitGlobalState(gs);
  }
  return gs;
}

Assistant:

static xmlGlobalStatePtr
xmlGetThreadLocalStorage(int allowFailure) {
    xmlGlobalState *gs;

    (void) allowFailure;

    xmlInitParser();

#ifdef USE_TLS
    gs = &globalState;
    if (gs->initialized == 0)
        xmlInitGlobalState(gs);
#elif defined(HAVE_POSIX_THREADS)
    gs = (xmlGlobalState *) pthread_getspecific(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#elif defined(HAVE_WIN32_THREADS)
    gs = (xmlGlobalState *) TlsGetValue(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#else
    gs = NULL;
#endif

    return(gs);
}